

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Order
          (Relation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *expressions)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  idx_t iVar4;
  ParserOptions options_00;
  Relation *pRVar5;
  ClientContext *pCVar6;
  DatabaseInstance *pDVar7;
  reference __args;
  ParserException *pPVar8;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *select_list;
  shared_ptr<duckdb::Relation,_true> sVar9;
  ParserOptions options;
  vector<duckdb::OrderByNode,_true> order_list;
  vector<duckdb::OrderByNode,_true> inner_list;
  undefined6 uStack_be;
  undefined1 local_a8 [32];
  vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> local_88;
  vector<duckdb::OrderByNode,_true> *local_70;
  Relation *local_68;
  vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> local_60;
  vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> local_48;
  
  select_list = (string *)*in_RDX;
  psVar3 = (string *)in_RDX[1];
  local_68 = this;
  if (select_list == psVar3) {
    pPVar8 = (ParserException *)__cxa_allocate_exception(0x10);
    local_a8._0_8_ = local_a8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"Zero ORDER BY expressions provided","");
    ParserException::ParserException(pPVar8,(string *)local_a8);
    __cxa_throw(pPVar8,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_88.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = (vector<duckdb::OrderByNode,_true> *)expressions;
  while( true ) {
    shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
              ((shared_ptr<duckdb::ClientContextWrapper,_true> *)(expressions + 1));
    ClientContextWrapper::GetContext((ClientContextWrapper *)local_a8);
    pCVar6 = shared_ptr<duckdb::ClientContext,_true>::operator->
                       ((shared_ptr<duckdb::ClientContext,_true> *)local_a8);
    bVar1 = (pCVar6->config).preserve_identifier_case;
    bVar2 = (pCVar6->config).integer_division;
    iVar4 = (pCVar6->config).max_expression_depth;
    pDVar7 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&pCVar6->db);
    options_00.integer_division = bVar2;
    options_00.preserve_identifier_case = bVar1;
    options_00._2_6_ = uStack_be;
    options_00.max_expression_depth = iVar4;
    options_00.extensions = &(pDVar7->config).parser_extensions;
    Parser::ParseOrderList((vector<duckdb::OrderByNode,_true> *)&local_60,select_list,options_00);
    if ((element_type *)local_a8._8_8_ != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
    if ((long)local_60.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_60.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x10) break;
    __args = vector<duckdb::OrderByNode,_true>::operator[]
                       ((vector<duckdb::OrderByNode,_true> *)&local_60,0);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::
    emplace_back<duckdb::OrderByNode>(&local_88,__args);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector(&local_60);
    pRVar5 = local_68;
    select_list = select_list + 1;
    if (select_list == psVar3) {
      local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_start =
           local_88.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage =
           local_88.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Order(local_68,local_70);
      ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector(&local_48);
      ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector(&local_88);
      sVar9.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      sVar9.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pRVar5;
      return (shared_ptr<duckdb::Relation,_true>)
             sVar9.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  pPVar8 = (ParserException *)__cxa_allocate_exception(0x10);
  local_a8._0_8_ = local_a8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"Expected a single ORDER BY expression in the expression list","");
  ParserException::ParserException(pPVar8,(string *)local_a8);
  __cxa_throw(pPVar8,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<Relation> Relation::Order(const vector<string> &expressions) {
	if (expressions.empty()) {
		throw ParserException("Zero ORDER BY expressions provided");
	}
	vector<OrderByNode> order_list;
	for (auto &expression : expressions) {
		auto inner_list = Parser::ParseOrderList(expression, context->GetContext()->GetParserOptions());
		if (inner_list.size() != 1) {
			throw ParserException("Expected a single ORDER BY expression in the expression list");
		}
		order_list.push_back(std::move(inner_list[0]));
	}
	return Order(std::move(order_list));
}